

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackArchiveGenerator::addOneComponentToArchive
          (cmCPackArchiveGenerator *this,cmArchiveWrite *archive,cmCPackComponent *component)

{
  _func_int **pp_Var1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  long *plVar4;
  _Alloc_hider msg;
  size_type sVar5;
  bool bVar6;
  ostream *poVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  pointer __rhs;
  string localToplevel;
  string rp;
  string filePrefix;
  ostringstream cmCPackLog_msg;
  cmWorkingDirectory workdir;
  long *local_278;
  long local_270;
  long local_268 [2];
  cmCPackComponent *local_258;
  cmArchiveWrite *local_250;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  cmWorkingDirectory local_50;
  
  local_258 = component;
  local_250 = archive;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"   - packaging component: ",0x1a);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1c8,(local_258->Name)._M_dataplus._M_p,
                      (local_258->Name)._M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  msg._M_p = local_248._M_dataplus._M_p;
  sVar8 = strlen(local_248._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,2,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x3b,msg._M_p,sVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pp_Var1 = (_func_int **)(local_1c8 + 0x10);
  local_1c8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
  std::__cxx11::string::string((string *)&local_248,pcVar9,(allocator *)&local_50);
  if ((_func_int **)local_1c8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,"/",
                 &local_258->Name);
  std::__cxx11::string::_M_append((char *)&local_248,local_1c8._0_8_);
  if ((_func_int **)local_1c8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
  cmWorkingDirectory::cmWorkingDirectory(&local_50,&local_248);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_1c8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY","");
  bVar6 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_1c8);
  if ((_func_int **)local_1c8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_1c8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CPACK_PACKAGE_FILE_NAME","");
    pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
    sVar5 = local_208._M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)sVar5,(ulong)pcVar9);
    if ((_func_int **)local_1c8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_208);
  }
  local_1c8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"CPACK_PACKAGING_INSTALL_PREFIX","");
  pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_1c8);
  if ((_func_int **)local_1c8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
  if (((pcVar9 != (char *)0x0) && (*pcVar9 == '/')) && (pcVar9[1] != '\0')) {
    std::__cxx11::string::append((char *)&local_208);
    std::__cxx11::string::append((char *)&local_208);
  }
  __rhs = (local_258->Files).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  iVar10 = 1;
  if (__rhs != (local_258->Files).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_228,&local_208,__rhs);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Adding file: ",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_228._M_dataplus._M_p,local_228._M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar4 = local_278;
      sVar8 = strlen((char *)local_278);
      cmCPackLog::Log(pcVar2,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x51,(char *)plVar4,sVar8);
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_228._M_dataplus._M_p,
                 local_228._M_dataplus._M_p + local_228._M_string_length);
      cmArchiveWrite::Add(local_250,&local_1e8,0,(char *)0x0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((local_250->Error)._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"ERROR while packaging files: ",0x1d);
        local_278 = local_268;
        pcVar3 = (local_250->Error)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar3,pcVar3 + (local_250->Error)._M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,(char *)local_278,local_270);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        plVar4 = local_278;
        sVar8 = strlen((char *)local_278);
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x55,(char *)plVar4,sVar8);
        if (local_278 != local_268) {
          operator_delete(local_278,local_268[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        goto LAB_002a58bf;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      __rhs = __rhs + 1;
    } while (__rhs != (local_258->Files).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    iVar10 = 1;
  }
LAB_002a58bf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  cmWorkingDirectory::~cmWorkingDirectory(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  return iVar10;
}

Assistant:

int cmCPackArchiveGenerator::addOneComponentToArchive(
  cmArchiveWrite& archive, cmCPackComponent* component)
{
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "   - packaging component: " << component->Name << std::endl);
  // Add the files of this component to the archive
  std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
  localToplevel += "/" + component->Name;
  // Change to local toplevel
  cmWorkingDirectory workdir(localToplevel);
  std::string filePrefix;
  if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
    filePrefix = this->GetOption("CPACK_PACKAGE_FILE_NAME");
    filePrefix += "/";
  }
  const char* installPrefix =
    this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  if (installPrefix && installPrefix[0] == '/' && installPrefix[1] != 0) {
    // add to file prefix and remove the leading '/'
    filePrefix += installPrefix + 1;
    filePrefix += "/";
  }
  std::vector<std::string>::const_iterator fileIt;
  for (fileIt = component->Files.begin(); fileIt != component->Files.end();
       ++fileIt) {
    std::string rp = filePrefix + *fileIt;
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "Adding file: " << rp << std::endl);
    archive.Add(rp, 0, CM_NULLPTR, false);
    if (!archive) {
      cmCPackLogger(cmCPackLog::LOG_ERROR, "ERROR while packaging files: "
                      << archive.GetError() << std::endl);
      return 0;
    }
  }
  return 1;
}